

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_function.hpp
# Opt level: O1

double __thiscall sisl::function::eval(function *this,double d0,...)

{
  char in_AL;
  uint uVar1;
  double *pdVar2;
  undefined8 *puVar3;
  undefined8 in_RCX;
  ulong uVar4;
  undefined8 in_RDX;
  ulong uVar5;
  undefined8 in_RSI;
  Index *pIVar6;
  ulong uVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  vector p;
  va_list args;
  double *local_108;
  ulong uStack_100;
  double local_f0;
  undefined8 local_e8;
  Index *local_e0;
  Index *local_d8;
  Index local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_f0 = d0;
  local_c8[1] = in_RSI;
  local_c8[2] = in_RDX;
  local_c8[3] = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  uVar1 = (*this->_vptr_function[0xc])();
  local_108 = (double *)0x0;
  uStack_100 = 0;
  if ((int)uVar1 < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  uVar8 = (ulong)uVar1;
  pdVar2 = local_108;
  if (uVar8 != 0) {
    free((void *)0x0);
    if (uVar1 == 0) {
      local_108 = (double *)0x0;
      pdVar2 = local_108;
    }
    else {
      pdVar2 = (double *)malloc(uVar8 * 8);
      if ((uVar1 != 1) && (((ulong)pdVar2 & 0xf) != 0)) {
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                      "void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      if (pdVar2 == (double *)0x0) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = std::ios::widen;
        __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  local_108 = pdVar2;
  uStack_100 = uVar8;
  if (uVar1 == 0) {
LAB_0010b2f4:
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  *local_108 = local_f0;
  local_d8 = local_c8;
  local_e0 = &p.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_e8 = 0x4000000008;
  if (1 < (int)uVar1) {
    uVar5 = 1;
    uVar4 = uVar8;
    if (uVar8 < 2) {
      uVar4 = 1;
    }
    do {
      uVar7 = (ulong)local_e8._4_4_;
      if (uVar7 < 0xa1) {
        local_e8 = CONCAT44(local_e8._4_4_ + 0x10,(undefined4)local_e8);
        pIVar6 = (Index *)((long)local_d8 + uVar7);
      }
      else {
        pIVar6 = local_e0;
        local_e0 = local_e0 + 1;
      }
      if (uVar4 == uVar5) goto LAB_0010b2f4;
      local_108[uVar5] = (double)*pIVar6;
      uVar5 = uVar5 + 1;
    } while (uVar8 != uVar5);
  }
  (*this->_vptr_function[3])(this,&local_108);
  local_f0 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  free(local_108);
  return local_f0;
}

Assistant:

virtual const double eval(double d0, ...) {
        	va_list args;  
        	int n = this->dim();
        	vector p(n);

        	p[0] = d0;
			va_start(args, d0);  
        	for(int i = 1; i < n; i++) {
        		p[i] = va_arg (args, double);
        	}
        	va_end (args);
        	return this->operator()(p);
        }